

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O0

Fodder * jsonnet::internal::concat_fodder(Fodder *a,Fodder *b)

{
  size_type sVar1;
  ulong uVar2;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_RDX;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_RSI;
  value_type *in_RDI;
  FodderElement *in_stack_00000008;
  Fodder *in_stack_00000010;
  uint i;
  Fodder *r;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffd4;
  
  sVar1 = std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::size(in_RSI);
  if (sVar1 == 0) {
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::vector(in_stack_00000010,
             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)in_stack_00000008);
  }
  else {
    sVar1 = std::
            vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            ::size(in_RDX);
    if (sVar1 == 0) {
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      vector(in_stack_00000010,
             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)in_stack_00000008);
    }
    else {
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      vector(in_stack_00000010,
             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)in_stack_00000008);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      operator[](in_RDX,0);
      fodder_push_back(in_stack_00000010,in_stack_00000008);
      for (uVar3 = 1; uVar2 = (ulong)uVar3,
          sVar1 = std::
                  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  ::size(in_RDX), uVar2 < sVar1; uVar3 = uVar3 + 1) {
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::operator[](in_RDX,(ulong)uVar3);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::push_back((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)CONCAT44(in_stack_ffffffffffffffd4,uVar3),in_RDI);
      }
    }
  }
  return (Fodder *)in_RDI;
}

Assistant:

static inline Fodder concat_fodder(const Fodder &a, const Fodder &b)
{
    if (a.size() == 0)
        return b;
    if (b.size() == 0)
        return a;
    Fodder r = a;
    // Carefully add the first element of b.
    fodder_push_back(r, b[0]);
    // Add the rest of b.
    for (unsigned i = 1; i < b.size(); ++i) {
        r.push_back(b[i]);
    }
    return r;
}